

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  int number;
  uint32 uVar1;
  Type TVar2;
  int local_24;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar1 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar2 = FieldDescriptor::type(field);
    ExtensionSet::SetEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),number,
               (FieldType)TVar2,value,field);
    return;
  }
  SetField<int>(this,message,field,&local_24);
  return;
}

Assistant:

void GeneratedMessageReflection::SetEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(),
                                          value, field);
  } else {
    SetField<int>(message, field, value);
  }
}